

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,UnaryOperator *o)

{
  UnaryOperator *pUVar1;
  bool bVar2;
  Expression *pEVar3;
  Constant *pCVar4;
  Value local_b8;
  undefined1 local_68 [8];
  Value result;
  pool_ptr<soul::AST::Constant> constant;
  UnaryOperator *o_local;
  ConstantFolder *this_local;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,o);
  bVar2 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    (&this->super_ErrorIgnoringRewritingASTVisitor,&o->super_Expression);
  if (bVar2) {
    return &o->super_Expression;
  }
  pEVar3 = pool_ref<soul::AST::Expression>::operator->(&o->source);
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
            (result.allocatedData.allocatedData.space);
  bVar2 = soul::pool_ptr::operator_cast_to_bool
                    ((pool_ptr *)result.allocatedData.allocatedData.space);
  if (bVar2) {
    pCVar4 = pool_ptr<soul::AST::Constant>::operator->
                       ((pool_ptr<soul::AST::Constant> *)result.allocatedData.allocatedData.space);
    soul::Value::Value((Value *)local_68,&pCVar4->value);
    bVar2 = UnaryOp::apply((Value *)local_68,o->operation);
    if (bVar2) {
      pEVar3 = pool_ref<soul::AST::Expression>::operator->(&o->source);
      soul::Value::Value(&local_b8,(Value *)local_68);
      this_local = (ConstantFolder *)
                   createConstant(this,&(pEVar3->super_Statement).super_ASTObject.context,&local_b8)
      ;
      soul::Value::~Value(&local_b8);
    }
    soul::Value::~Value((Value *)local_68);
    if (bVar2) goto LAB_00453b91;
  }
  bVar2 = false;
LAB_00453b91:
  pool_ptr<soul::AST::Constant>::~pool_ptr
            ((pool_ptr<soul::AST::Constant> *)result.allocatedData.allocatedData.space);
  pUVar1 = o;
  if (bVar2 != false) {
    pUVar1 = (UnaryOperator *)this_local;
  }
  this_local = (ConstantFolder *)pUVar1;
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::UnaryOperator& o) override
        {
            super::visit (o);

            if (failIfNotResolved (o))
                return o;

            if (auto constant = o.source->getAsConstant())
            {
                auto result = constant->value;

                if (UnaryOp::apply (result, o.operation))
                    return createConstant (o.source->context, std::move (result));
            }

            return o;
        }